

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::findString
                    (QStringView haystack,qsizetype from,QLatin1StringView needle,CaseSensitivity cs
                    )

{
  long lVar1;
  QLatin1StringView str;
  qsizetype qVar2;
  qsizetype qVar3;
  QChar *str_00;
  QVarLengthArray<char16_t,_256LL> *in_RDX;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  QVarLengthArray<char16_t,_256LL> s;
  QVLABaseBase *this;
  undefined4 in_stack_fffffffffffffd70;
  qsizetype local_280;
  QLatin1String local_240;
  QStringView local_230;
  QVLABaseBase local_220 [3];
  CaseSensitivity in_stack_fffffffffffffe3c;
  qsizetype in_stack_fffffffffffffe40;
  QStringView in_stack_fffffffffffffeb0;
  QStringView in_stack_fffffffffffffec0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QStringView::size(&local_230);
  qVar3 = QLatin1String::size(&local_240);
  if (qVar2 < qVar3) {
    local_280 = -1;
  }
  else {
    this = local_220;
    memset(this,0xaa,0x218);
    str.m_size._4_4_ = in_R9D;
    str.m_size._0_4_ = in_stack_fffffffffffffd70;
    str.m_data = (char *)in_RDX;
    qt_from_latin1_to_qvla(str);
    str_00 = (QChar *)QVarLengthArray<char16_t,_256LL>::constData
                                ((QVarLengthArray<char16_t,_256LL> *)0x50e26a);
    QVLABaseBase::size(local_220);
    QStringView::QStringView<QChar,_true>((QStringView *)this,str_00,(qsizetype)in_RDX);
    local_280 = findString(in_stack_fffffffffffffec0,in_stack_fffffffffffffe40,
                           in_stack_fffffffffffffeb0,in_stack_fffffffffffffe3c);
    QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(in_RDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_280;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::findString(QStringView haystack, qsizetype from, QLatin1StringView needle, Qt::CaseSensitivity cs) noexcept
{
    if (haystack.size() < needle.size())
        return -1;

    QVarLengthArray<char16_t> s = qt_from_latin1_to_qvla(needle);
    return QtPrivate::findString(haystack, from, QStringView(reinterpret_cast<const QChar*>(s.constData()), s.size()), cs);
}